

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

void monstone(monst *mdef)

{
  char cVar1;
  char cVar2;
  permonst *ptr;
  obj *poVar3;
  undefined1 uVar4;
  boolean bVar5;
  uint uVar6;
  int iVar7;
  obj *in_RAX;
  obj *poVar8;
  char *pcVar9;
  char *pcVar10;
  int y;
  obj *obj;
  int x;
  monst *pmVar11;
  
  cVar1 = mdef->mx;
  cVar2 = mdef->my;
  lifesaved_monster(mdef,0x12);
  if (mdef->mhp < 1) {
    mdef->field_0x62 = mdef->field_0x62 & 0x7f;
    x = (int)cVar1;
    y = (int)cVar2;
    if ((mdef->data->msize == '\0') &&
       (iVar7 = rn2(3 - (uint)((mdef->data->geno & 7) < 3)), iVar7 != 0)) {
      poVar8 = mksobj_at(0x213,level,(int)cVar1,(int)cVar2,'\x01','\0');
    }
    else {
      obj = (obj *)0x0;
      while( true ) {
        uVar6 = (uint)((ulong)in_RAX >> 0x20);
        poVar8 = mdef->minvent;
        if (poVar8 == (obj *)0x0) break;
        obj_extract_self(poVar8);
        if (poVar8->owornmask != 0) {
          update_mon_intrinsics(level,mdef,poVar8,'\0','\x01');
        }
        obj_no_longer_held(poVar8);
        if ((poVar8->owornmask & 0x100) != 0) {
          setmnotwielded(mdef,poVar8);
        }
        poVar8->owornmask = 0;
        if ((poVar8->otyp == 0x214) || (bVar5 = obj_resists(poVar8,0,0), bVar5 != '\0')) {
          bVar5 = flooreffects(poVar8,x,y,"fall");
          if (bVar5 == '\0') {
            place_object(poVar8,level,(int)cVar1,(int)cVar2);
          }
        }
        else {
          if ((poVar8->field_0x4c & 8) != 0) {
            end_burn(poVar8,'\x01');
          }
          poVar8->nobj = obj;
          obj = poVar8;
        }
      }
      pmVar11 = mdef;
      if ((((mdef->field_0x63 & 2) == 0) && (mdef->mtame == '\0')) &&
         (ptr = mdef->data,
         (ptr != mons + 0x145 && (ptr != mons + 0x146 && ptr != mons + 0x144)) &&
         (ptr->geno & 0x1000) == 0)) {
        if (((ptr->mlet != '.') && ((ptr == mons + 0xfd || ptr == mons + 0xfe) || ptr->mlet != '4'))
           && ((mdef->m_id != quest_status.leader_m_id &&
               ((bVar5 = dmgtype(ptr,0x16), bVar5 == '\0' &&
                (bVar5 = dmgtype(mdef->data,0x23), bVar5 == '\0')))))) {
          pmVar11 = (monst *)0x0;
        }
      }
      in_RAX = (obj *)((ulong)uVar6 << 0x20);
      poVar8 = mkcorpstat(0x215,pmVar11,mdef->data,level,x,y,'\0');
      if (mdef->mnamelth != '\0') {
        poVar8 = oname(poVar8,(char *)((long)(mdef->mtrack + 0x18) + (long)mdef->mxlth));
      }
      while (obj != (obj *)0x0) {
        poVar3 = obj->nobj;
        add_to_container(poVar8,obj);
        obj = poVar3;
      }
      if ((mdef->data->geno & 0x1000) != 0) {
        poVar8->spe = '\x01';
      }
      uVar6 = weight(poVar8);
      poVar8->owt = uVar6;
    }
    stackobj(in_RAX);
    if ((level->locations[cVar1][cVar2].field_0x6 & 8) != 0) {
      unmap_object(x,y);
    }
    if ((viz_array[cVar2][cVar1] & 2U) != 0) {
      newsym(x,y);
    }
    pmVar11 = u.ustuck;
    uVar4 = u._1052_1_;
    mondead(mdef);
    if ((((uVar4 & 1) != 0) && (pmVar11 == mdef)) && ((mdef->data->mflags1 & 0x40000) != 0)) {
      pcVar9 = locomotion(youmonst.data,"jump");
      pcVar10 = xname(poVar8);
      pline("You %s through an opening in the new %s.",pcVar9,pcVar10);
      return;
    }
  }
  return;
}

Assistant:

void monstone(struct monst *mdef)
{
	struct obj *otmp, *obj, *oldminvent;
	xchar x = mdef->mx, y = mdef->my;
	boolean wasinside = FALSE;

	/* we have to make the statue before calling mondead, to be able to
	 * put inventory in it, and we have to check for lifesaving before
	 * making the statue....
	 */
	lifesaved_monster(mdef, AD_STON);
	if (mdef->mhp > 0) return;

	mdef->mtrapped = 0;	/* (see m_detach) */

	if ((int)mdef->data->msize > MZ_TINY ||
		    !rn2(2 + ((int) (mdef->data->geno & G_FREQ) > 2))) {
		oldminvent = 0;
		/* some objects may end up outside the statue */
		while ((obj = mdef->minvent) != 0) {
		    obj_extract_self(obj);
		    if (obj->owornmask)
			update_mon_intrinsics(level, mdef, obj, FALSE, TRUE);
		    obj_no_longer_held(obj);
		    if (obj->owornmask & W_WEP)
			setmnotwielded(mdef,obj);
		    obj->owornmask = 0L;
		    if (obj->otyp == BOULDER ||
				obj_resists(obj, 0, 0)) {
			if (flooreffects(obj, x, y, "fall")) continue;
			place_object(obj, level, x, y);
		    } else {
			if (obj->lamplit) end_burn(obj, TRUE);
			obj->nobj = oldminvent;
			oldminvent = obj;
		    }
		}
		
		/* defer statue creation until after inventory removal
		   so that saved monster traits won't retain any stale
		   item-conferred attributes */
		otmp = mkcorpstat(STATUE, KEEPTRAITS(mdef) ? mdef : 0,
				  mdef->data, level, x, y, FALSE);
		if (mdef->mnamelth) otmp = oname(otmp, NAME(mdef));
		while ((obj = oldminvent) != 0) {
		    oldminvent = obj->nobj;
		    add_to_container(otmp, obj);
		}
		/* Archeologists should not break unique statues */
		if (mdef->data->geno & G_UNIQ)
			otmp->spe = 1;
		otmp->owt = weight(otmp);
	} else
		otmp = mksobj_at(ROCK, level, x, y, TRUE, FALSE);

	stackobj(otmp);
	/* mondead() already does this, but we must do it before the newsym */
	if (level->locations[x][y].mem_invis)
	    unmap_object(x, y);
	if (cansee(x, y))
	    newsym(x,y);
	/* We don't currently trap the hero in the statue in this case but we could */
	if (u.uswallow && u.ustuck == mdef) wasinside = TRUE;
	mondead(mdef);
	if (wasinside) {
		if (is_animal(mdef->data))
			pline("You %s through an opening in the new %s.",
				locomotion(youmonst.data, "jump"),
				xname(otmp));
	}
}